

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int block_cmp(void *va,void *vb)

{
  envy_bios_block *b;
  envy_bios_block *a;
  void *vb_local;
  void *va_local;
  
  if (*va < *vb) {
    va_local._4_4_ = -1;
  }
  else if (*vb < *va) {
    va_local._4_4_ = 1;
  }
  else {
    va_local._4_4_ = 0;
  }
  return va_local._4_4_;
}

Assistant:

static int block_cmp(const void *va, const void *vb) {
	const struct envy_bios_block *a = va;
	const struct envy_bios_block *b = vb;
	if (a->start < b->start)
		return -1;
	if (a->start > b->start)
		return 1;
	return 0;
}